

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O0

void uv::TCPClient::AfterClientClose(uv_handle_t *handle)

{
  void *pvVar1;
  CStringStream *pCVar2;
  ILog4zManager *pIVar3;
  long *in_FS_OFFSET;
  string local_58;
  undefined1 local_38 [8];
  CStringStream ss;
  int iret;
  TCPClient *theclass;
  uv_handle_t *handle_local;
  
  pvVar1 = handle->data;
  fprintf(_stdout,"Close CB handle %p\n",handle);
  if ((handle == *(uv_handle_t **)((long)pvVar1 + 8)) &&
     ((*(byte *)((long)pvVar1 + 0x588) & 1) != 0)) {
    ss.m_pCur._4_4_ = 0;
    ss.m_pCur._4_4_ =
         uv_timer_start((long)pvVar1 + 0x4f0,ReconnectTimer,*(undefined8 *)((long)pvVar1 + 0x590),
                        *(undefined8 *)((long)pvVar1 + 0x590));
    if (ss.m_pCur._4_4_ != 0) {
      uv_close((long)pvVar1 + 0x4f0,AfterClientClose);
      zsummer::log4z::CStringStream::CStringStream
                ((CStringStream *)local_38,(char *)(*in_FS_OFFSET + -0x800),0x800);
      GetUVError_abi_cxx11_(&local_58,ss.m_pCur._4_4_);
      zsummer::log4z::CStringStream::operator<<((CStringStream *)local_38,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      pCVar2 = zsummer::log4z::CStringStream::operator<<((CStringStream *)local_38," ( ");
      pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2," ");
      pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2," ) : ");
      zsummer::log4z::CStringStream::operator<<(pCVar2,0x1a1);
      pIVar3 = zsummer::log4z::ILog4zManager::GetInstance();
      (*pIVar3->_vptr_ILog4zManager[8])(pIVar3,0,3,*in_FS_OFFSET + -0x800);
    }
  }
  return;
}

Assistant:

void TCPClient::AfterClientClose(uv_handle_t* handle)
{
    TCPClient* theclass = (TCPClient*)handle->data;
    fprintf(stdout, "Close CB handle %p\n", handle);
    if (handle == (uv_handle_t*)&theclass->client_handle_->tcphandle && theclass->isreconnecting_) {
        //closed, start reconnect timer
        int iret = 0;
        iret = uv_timer_start(&theclass->reconnect_timer_, TCPClient::ReconnectTimer, theclass->repeat_time_, theclass->repeat_time_);
        if (iret) {
            uv_close((uv_handle_t*)&theclass->reconnect_timer_, TCPClient::AfterClientClose);
            LOGE(GetUVError(iret));
            return;
        }
    }
}